

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

Module * mocker::allocateRegisters(Module *__return_storage_ptr__,Module *module)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  _List_const_iterator<mocker::nasm::Line> *p_Var3;
  _List_const_iterator<mocker::nasm::Line> *p_Var4;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  _List_const_iterator<mocker::nasm::Line> *local_468;
  iterator iStack_460;
  _List_const_iterator<mocker::nasm::Line> *local_458;
  Module *local_448;
  undefined1 local_440 [24];
  InterferenceGraph local_428;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_180;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_148;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_110;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  local_448 = __return_storage_ptr__;
  local_440._0_8_ = (_List_node_base *)(local_440 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,".text","");
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(__return_storage_ptr__->sections)._M_h,(key_type *)local_440);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_001356cb:
    std::__throw_out_of_range("_Map_base::at");
  }
  if ((_List_node_base *)local_440._0_8_ != (_List_node_base *)(local_440 + 0x10)) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  local_468 = (_List_const_iterator<mocker::nasm::Line> *)0x0;
  iStack_460._M_current = (_List_const_iterator<mocker::nasm::Line> *)0x0;
  local_458 = (_List_const_iterator<mocker::nasm::Line> *)0x0;
  p_Var1 = (_List_node_base *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                  ._M_cur + 0x48);
  local_440._0_8_ =
       *(long *)((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                       ._M_cur + 0x48);
  if ((_List_node_base *)local_440._0_8_ != p_Var1) {
    do {
      if (((_List_node_base *)(local_440._0_8_ + 0x30))->_M_next == (_List_node_base *)0x0) {
        if (((_List_node_base *)(local_440._0_8_ + 0x10))->_M_prev == (_List_node_base *)0x0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
          goto LAB_001356cb;
        }
        if (*(char *)&((_List_node_base *)(local_440._0_8_ + 0x10))->_M_next->_M_next != '.') {
          if (iStack_460._M_current == local_458) {
            std::
            vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
            ::_M_realloc_insert<std::_List_iterator<mocker::nasm::Line>&>
                      ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                        *)&local_468,iStack_460,(_List_iterator<mocker::nasm::Line> *)local_440);
          }
          else {
            (iStack_460._M_current)->_M_node = (_List_node_base *)local_440._0_8_;
            iStack_460._M_current = iStack_460._M_current + 1;
          }
        }
      }
      local_440._0_8_ = *(_List_node_base **)local_440._0_8_;
    } while ((_List_node_base *)local_440._0_8_ != p_Var1);
  }
  local_440._0_8_ = p_Var1;
  if (iStack_460._M_current == local_458) {
    std::
    vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
    ::_M_realloc_insert<std::_List_iterator<mocker::nasm::Line>>
              ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                *)&local_468,iStack_460,(_List_iterator<mocker::nasm::Line> *)local_440);
  }
  else {
    (iStack_460._M_current)->_M_node = p_Var1;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  p_Var4 = iStack_460._M_current + -1;
  if (local_468 != p_Var4) {
    p_Var3 = local_468;
    do {
      detail::RegisterAllocator::RegisterAllocator
                ((RegisterAllocator *)local_440,
                 (Section *)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                        ._M_cur + 0x28),p_Var3->_M_node,p_Var3[1]._M_node);
      detail::RegisterAllocator::allocate((RegisterAllocator *)local_440);
      p_Var3 = p_Var3 + 1;
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_d8);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_110);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_148);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_180);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_1b8);
      detail::InterferenceGraph::~InterferenceGraph(&local_428);
    } while (p_Var3 != p_Var4);
  }
  if (local_468 != (_List_const_iterator<mocker::nasm::Line> *)0x0) {
    operator_delete(local_468,(long)local_458 - (long)local_468);
  }
  return local_448;
}

Assistant:

nasm::Module allocateRegisters(const nasm::Module &module) {
  auto res = module;
  auto &text = res.getSection(".text");
  std::vector<LineIter> funcBegs;
  for (auto iter = text.getLines().begin(); iter != text.getLines().end();
       ++iter) {
    if (!iter->inst && iter->label.at(0) != '.')
      funcBegs.emplace_back(iter);
  }

  funcBegs.emplace_back(text.getLines().end());
  for (auto iter = funcBegs.begin(), ed = std::prev(funcBegs.end()); iter != ed;
       ++iter) {
    detail::RegisterAllocator(text, *iter, *(iter + 1)).allocate();
  }
  return res;
}